

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemView::setItemDelegateForColumn
          (QAbstractItemView *this,int column,QAbstractItemDelegate *delegate)

{
  QMap<int,_QPointer<QAbstractItemDelegate>_> *this_00;
  QAbstractItemViewPrivate *this_01;
  int iVar1;
  QWidget *this_02;
  Data *pDVar2;
  QObject *delegate_00;
  long in_FS_OFFSET;
  QPointer<QAbstractItemDelegate> local_48;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractItemViewPrivate **)(this + 8);
  this_00 = &this_01->columnDelegates;
  local_34 = column;
  QMap<int,_QPointer<QAbstractItemDelegate>_>::value
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)&local_48,(int *)this_00,
             (QPointer<QAbstractItemDelegate> *)&local_34);
  if (local_48.wp.d == (Data *)0x0) {
    delegate_00 = (QObject *)0x0;
  }
  else {
    delegate_00 = local_48.wp.value;
    if (*(int *)(local_48.wp.d + 4) == 0) {
      delegate_00 = (QObject *)0x0;
    }
    LOCK();
    *(int *)local_48.wp.d = *(int *)local_48.wp.d + -1;
    UNLOCK();
    if (*(int *)local_48.wp.d == 0) {
      pDVar2 = local_48.wp.d;
      if (local_48.wp.d == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
    }
  }
  if (delegate_00 != (QObject *)0x0) {
    iVar1 = QAbstractItemViewPrivate::delegateRefCount(this_01,(QAbstractItemDelegate *)delegate_00)
    ;
    if (iVar1 == 1) {
      QAbstractItemViewPrivate::disconnectDelegate(this_01,(QAbstractItemDelegate *)delegate_00);
    }
    QMap<int,_QPointer<QAbstractItemDelegate>_>::remove(this_00,(char *)&local_34);
  }
  if (delegate != (QAbstractItemDelegate *)0x0) {
    iVar1 = QAbstractItemViewPrivate::delegateRefCount(this_01,delegate);
    if (iVar1 == 0) {
      QAbstractItemViewPrivate::connectDelegate(this_01,delegate);
    }
    local_48.wp.d =
         (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&delegate->super_QObject);
    local_48.wp.value = &delegate->super_QObject;
    QMap<int,_QPointer<QAbstractItemDelegate>_>::insert(this_00,&local_34,&local_48);
    if (local_48.wp.d != (Data *)0x0) {
      LOCK();
      *(int *)local_48.wp.d = *(int *)local_48.wp.d + -1;
      UNLOCK();
      if (*(int *)local_48.wp.d == 0) {
        pDVar2 = local_48.wp.d;
        if (local_48.wp.d == (Data *)0x0) {
          pDVar2 = (Data *)0x0;
        }
        operator_delete(pDVar2);
      }
    }
  }
  this_02 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  QWidget::update(this_02);
  if (this_01->delayedPendingLayout == false) {
    this_01->delayedPendingLayout = true;
    QBasicTimer::start(&this_01->delayedLayout,0,1,
                       *(undefined8 *)
                        &(this_01->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate.field_0x8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setItemDelegateForColumn(int column, QAbstractItemDelegate *delegate)
{
    Q_D(QAbstractItemView);
    if (QAbstractItemDelegate *columnDelegate = d->columnDelegates.value(column, nullptr)) {
        if (d->delegateRefCount(columnDelegate) == 1)
            d->disconnectDelegate(columnDelegate);
        d->columnDelegates.remove(column);
    }
    if (delegate) {
        if (d->delegateRefCount(delegate) == 0)
            d->connectDelegate(delegate);
        d->columnDelegates.insert(column, delegate);
    }
    viewport()->update();
    d->doDelayedItemsLayout();
}